

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O2

void __thiscall
CreateCharacterState::processConfirmCharacter
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  element_type *peVar1;
  GameData *pGVar2;
  undefined1 *puVar3;
  element_type *this_00;
  bool bVar4;
  string *psVar5;
  string *__args_3;
  shared_ptr<GameData> *game_data;
  shared_ptr<Player> player;
  shared_ptr<Race> character_race;
  string command;
  __shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> local_170;
  undefined1 local_160 [16];
  undefined1 local_150 [32];
  __shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_120,(string *)input);
  std::__cxx11::string::string((string *)&local_60,(string *)input);
  Tokenizer::LowerCase(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar4 = std::operator==(&local_120,"y");
  if (!bVar4) {
    bVar4 = std::operator==(&local_120,"yes");
    if (!bVar4) {
      std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x10),
                 &connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>);
      (*(this->super_GameState)._vptr_GameState[1])
                (this,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)(local_150 + 0x10));
      puVar3 = local_150 + 0x10;
      goto LAB_00168ccd;
    }
  }
  peVar1 = (this->super_GameState).game_data.
           super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar5 = Connection::GetCharacterRace_abi_cxx11_
                     ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  std::__cxx11::string::string(local_80,(string *)psVar5);
  GameData::GetRace((GameData *)local_150,(string *)peVar1);
  std::__cxx11::string::~string(local_80);
  local_160._0_4_ =
       Connection::GetID((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
  psVar5 = Connection::GetCharacterName_abi_cxx11_
                     ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  __args_3 = Connection::GetCharacterClass_abi_cxx11_
                       ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
  std::
  make_shared<Player,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((int *)&local_170,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,psVar5,
             __args_3);
  Player::SetStrength(local_170._M_ptr,this->m_str);
  Player::SetEndurance(local_170._M_ptr,this->m_end);
  Player::SetIntelligence(local_170._M_ptr,this->m_int);
  Player::SetDexterity(local_170._M_ptr,this->m_dex);
  Player::SetSkill(local_170._M_ptr,this->m_skill);
  Player::SetAttributePoints(local_170._M_ptr,this->m_att_points);
  this_00 = local_170._M_ptr;
  game_data = &(this->super_GameState).game_data;
  peVar1 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar5 = Player::GetPlayerRaceStr_abi_cxx11_(local_170._M_ptr);
  std::__cxx11::string::string(local_a0,(string *)psVar5);
  GameData::GetRace((GameData *)local_160,(string *)peVar1);
  Player::SetPlayerRace(this_00,(shared_ptr<Race> *)local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160 + 8));
  std::__cxx11::string::~string(local_a0);
  Player::SetCredits(local_170._M_ptr,50000);
  pGVar2 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  Connection::GetUsername_abi_cxx11_
            (&local_c0,
             (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::__shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_130,&local_170);
  GameData::AddCharacter(pGVar2,&local_c0,(shared_ptr<Player> *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  std::__cxx11::string::~string((string *)&local_c0);
  pGVar2 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_e0,(string *)&GameData::CHARACTER_FILE_abi_cxx11_);
  GameData::SaveCharacters(pGVar2,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pGVar2 = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_100,(string *)&GameData::ACCOUNT_FILE_abi_cxx11_);
  GameData::SaveAccounts(pGVar2,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  Connection::SetPlayer
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (shared_ptr<Player> *)&local_170);
  local_160._0_2_ = 1;
  Connection::SetState
            ((connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (GameStates *)local_160,game_data);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
  puVar3 = local_150;
LAB_00168ccd:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 8));
  std::__cxx11::string::~string((string *)&local_120);
  return;
}

Assistant:

void CreateCharacterState::processConfirmCharacter(const std::string &input, std::shared_ptr<Connection> connection) {
    std::string command = input;
    Tokenizer::LowerCase(input);
    if(command == "y" or command == "yes") {
        auto character_race = game_data->GetRace(connection->GetCharacterRace());
        std::shared_ptr<Player> player = std::make_shared<Player>(connection->GetID(), connection->GetCharacterName(),
                                                                  connection->GetCharacterClass(), character_race->getRace_name());
        player->SetStrength(m_str);
        player->SetEndurance(m_end);
        player->SetIntelligence(m_int);
        player->SetDexterity(m_dex);
        player->SetSkill(m_skill);
        player->SetAttributePoints(m_att_points);
        player->SetPlayerRace(game_data->GetRace(player->GetPlayerRaceStr()));
        player->SetCredits(50000);
        game_data->AddCharacter(connection->GetUsername(), player);
        game_data->SaveCharacters(GameData::CHARACTER_FILE);
        game_data->SaveAccounts(GameData::ACCOUNT_FILE);
        connection->SetPlayer(player);
        connection->SetState(GameStates::PLAYING, game_data);
    }
    else
        init(connection);
}